

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O0

void Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::
     parseLoopAttributes(char *content,SizeT end_offset,LoopTag *tag)

{
  char cVar1;
  SizeT SVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  byte local_49;
  char quote_char;
  SizeT att_offset;
  SizeT tmp_length;
  LoopAttributes att_type;
  SizeT offset;
  LoopTag *tag_local;
  SizeT end_offset_local;
  char *content_local;
  
  tmp_length = tag->Offset + 5;
  att_offset._3_1_ = 0;
  do {
    while( true ) {
      bVar5 = false;
      if (tmp_length < end_offset) {
        bVar5 = content[tmp_length] == ' ';
      }
      if (!bVar5) break;
      tmp_length = tmp_length + 1;
    }
    if (tmp_length < end_offset) {
      cVar1 = content[tmp_length];
      if (cVar1 == 'g') {
        if ((end_offset - tmp_length < 6) ||
           (bVar5 = StringUtils::IsEqual<char>(content + tmp_length,"group",5), !bVar5)) {
          tmp_length = tmp_length + 1;
        }
        else {
          tmp_length = tmp_length + 5;
          att_offset._3_1_ = 4;
        }
        goto LAB_0011a3f2;
      }
      if (cVar1 == 's') {
        if ((end_offset - tmp_length < 4) ||
           (bVar5 = StringUtils::IsEqual<char>(content + tmp_length,"set",3), !bVar5)) {
          if ((end_offset - tmp_length < 5) ||
             (bVar5 = StringUtils::IsEqual<char>(content + tmp_length,"sort",4), !bVar5)) {
            tmp_length = tmp_length + 1;
          }
          else {
            tmp_length = tmp_length + 4;
            att_offset._3_1_ = 3;
          }
        }
        else {
          tmp_length = tmp_length + 3;
          att_offset._3_1_ = 1;
        }
        goto LAB_0011a3f2;
      }
      if (cVar1 == 'v') {
        if ((end_offset - tmp_length < 6) ||
           (bVar5 = StringUtils::IsEqual<char>(content + tmp_length,"value",5), !bVar5)) {
          tmp_length = tmp_length + 1;
        }
        else {
          tmp_length = tmp_length + 5;
          att_offset._3_1_ = 2;
        }
        goto LAB_0011a3f2;
      }
      SVar2 = tmp_length + 1;
    }
    else {
LAB_0011a3f2:
      while( true ) {
        bVar5 = false;
        if (tmp_length < end_offset) {
          bVar5 = content[tmp_length] != '=';
        }
        SVar2 = tmp_length;
        if (!bVar5) break;
        tmp_length = tmp_length + 1;
      }
      do {
        tmp_length = SVar2;
        SVar2 = tmp_length + 1;
        bVar5 = false;
        if (SVar2 < end_offset) {
          bVar5 = content[SVar2] == ' ';
        }
      } while (bVar5);
      if (SVar2 < end_offset) {
        uVar3 = tmp_length + 2;
        uVar4 = SVar2;
        do {
          tmp_length = uVar4;
          uVar4 = tmp_length + 1;
          bVar5 = false;
          if (uVar4 < end_offset) {
            bVar5 = content[uVar4] != content[SVar2];
          }
        } while (bVar5);
        cVar1 = (char)uVar3;
        switch(att_offset._3_1_) {
        case 1:
          (tag->Set).Offset = uVar3;
          (tag->Set).Length = (short)uVar4 - (short)uVar3;
          checkLoopVariable(content,&tag->Set,tag->Parent);
          break;
        case 2:
          tag->ValueOffset = cVar1 - (char)tag->Offset;
          tag->ValueLength = (char)uVar4 - cVar1;
          break;
        case 3:
          local_49 = 2;
          if (content[uVar3] != 'a') {
            local_49 = 4;
          }
          tag->Options = tag->Options | local_49;
          break;
        case 4:
          tag->GroupOffset = cVar1 - (char)tag->Offset;
          tag->GroupLength = (char)uVar4 - cVar1;
        }
        SVar2 = tmp_length + 2;
      }
    }
    tmp_length = SVar2;
    if (end_offset <= tmp_length) {
      return;
    }
  } while( true );
}

Assistant:

inline static void parseLoopAttributes(const Char_T *content, const SizeT end_offset, LoopTag &tag) noexcept {
        enum struct LoopAttributes : SizeT8 { None = 0, Set, Value, Sort, Group };
        SizeT offset = (tag.Offset + TagPatterns::LoopPrefixLength);

        LoopAttributes att_type = LoopAttributes::None;

        do {
            while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar)) {
                ++offset;
            }

            if (offset < end_offset) {
                switch (content[offset]) {
                    case TagPatterns::SetSortChar: {
                        const SizeT tmp_length = (end_offset - offset);

                        if ((tmp_length > TagPatterns::SetLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Set, TagPatterns::SetLength)) {
                            offset += TagPatterns::SetLength;
                            att_type = LoopAttributes::Set;
                            break;
                        }

                        if ((tmp_length > TagPatterns::SortLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Sort, TagPatterns::SortLength)) {
                            offset += TagPatterns::SortLength;
                            att_type = LoopAttributes::Sort;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::ValueChar: {
                        if (((end_offset - offset) > TagPatterns::ValueLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Value, TagPatterns::ValueLength)) {
                            offset += TagPatterns::ValueLength;
                            att_type = LoopAttributes::Value;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::GroupChar: {
                        if (((end_offset - offset) > TagPatterns::GroupLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Group, TagPatterns::GroupLength)) {
                            offset += TagPatterns::GroupLength;
                            att_type = LoopAttributes::Group;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    default: {
                        ++offset;
                        continue;
                    }
                }
            }

            while ((offset < end_offset) && (content[offset] != TagPatterns::EqualChar)) {
                ++offset;
            }

            do {
                ++offset;
            } while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar));

            if (offset < end_offset) {
                const SizeT  att_offset = (offset + SizeT{1});
                const Char_T quote_char = content[offset];

                do {
                    ++offset;
                } while ((offset < end_offset) && (content[offset] != quote_char));

                switch (att_type) {
                    case LoopAttributes::Set: {
                        tag.Set.Offset = att_offset;
                        tag.Set.Length = SizeT16(offset - att_offset);
                        checkLoopVariable(content, tag.Set, tag.Parent);
                        break;
                    }

                    case LoopAttributes::Value: {
                        tag.ValueOffset = SizeT8(att_offset - tag.Offset);
                        tag.ValueLength = SizeT8(offset - att_offset);
                        break;
                    }

                    case LoopAttributes::Sort: {
                        tag.Options |=
                            ((content[att_offset] == 'a') ? LoopTagOptions::SortAscend : LoopTagOptions::SortDescend);
                        break;
                    }

                    case LoopAttributes::Group: {
                        tag.GroupOffset = SizeT8(att_offset - tag.Offset);
                        tag.GroupLength = SizeT8(offset - att_offset);
                        break;
                    }

                    default: {
                    }
                }

                ++offset;
            }
        } while (offset < end_offset);
    }